

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_ASCII85Decoder.hh
# Opt level: O0

void __thiscall Pl_ASCII85Decoder::~Pl_ASCII85Decoder(Pl_ASCII85Decoder *this)

{
  Pl_ASCII85Decoder *this_local;
  
  Pipeline::~Pipeline(&this->super_Pipeline);
  return;
}

Assistant:

~Pl_ASCII85Decoder() final = default;